

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_pack4to1.h
# Opt level: O0

void ncnn::convolution_pack4to1_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_packed,Mat *bias_data,int kernel_w,
               int kernel_h,int dilation_w,int dilation_h,int stride_w,int stride_h,
               int activation_type,Mat *activation_params,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  float *pfVar6;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  double dVar7;
  undefined1 auVar8 [16];
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  undefined4 in_stack_00000028;
  long *in_stack_00000030;
  __m128 _w;
  __m128 _val;
  int k;
  float *sptr;
  Mat m_2;
  int q;
  float *kptr;
  __m128 _sum;
  float sum;
  int j_1;
  int i_1;
  float *outptr;
  int p;
  float *bias_data_ptr;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outch;
  int outh;
  int outw;
  int channels;
  int w;
  Mat *m;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  Mat *m_3;
  Mat *m_1;
  __m128 x32;
  __m128 x64;
  float local_6bc;
  allocator_type *in_stack_fffffffffffff950;
  undefined4 in_stack_fffffffffffff958;
  undefined4 in_stack_fffffffffffff95c;
  undefined4 in_stack_fffffffffffff960;
  undefined4 in_stack_fffffffffffff964;
  int local_5e4;
  undefined8 local_5d8;
  undefined8 local_5d0;
  undefined8 local_5c8;
  undefined4 local_5c0;
  long local_5b8;
  undefined4 local_5b0;
  undefined4 local_5ac;
  undefined4 local_5a8;
  undefined4 local_5a4;
  undefined4 local_5a0;
  undefined8 local_598;
  int local_58c;
  undefined8 local_588;
  undefined8 local_580;
  undefined8 local_578;
  undefined4 local_570;
  long local_568;
  undefined4 local_560;
  undefined4 local_55c;
  undefined4 local_558;
  undefined4 local_554;
  undefined4 local_550;
  undefined8 local_548;
  undefined8 *local_540;
  undefined8 local_538;
  undefined8 uStack_530;
  float local_51c;
  int local_518;
  int local_514;
  undefined8 local_510;
  undefined8 local_508;
  undefined8 local_500;
  undefined4 local_4f8;
  long local_4f0;
  undefined4 local_4e8;
  undefined4 local_4e4;
  undefined4 local_4e0;
  undefined4 local_4dc;
  undefined4 local_4d8;
  undefined8 local_4d0;
  long local_4c8;
  int local_4bc;
  long local_4b8;
  int local_4ac;
  int local_4a8;
  int local_4a4;
  int local_4a0;
  int local_49c;
  reference local_498;
  vector<int,_std::allocator<int>_> local_478;
  int local_460;
  int local_45c;
  int local_458;
  int local_454;
  int local_450;
  int local_44c;
  int local_448;
  int local_444;
  long *local_440;
  long *local_438;
  long *local_430;
  long *local_428;
  undefined8 *local_420;
  undefined8 *local_410;
  allocator_type *local_400;
  allocator_type *local_3d8;
  undefined8 *local_3b8;
  undefined8 *local_398;
  undefined1 local_38d;
  int local_38c;
  undefined8 *local_380;
  undefined8 *local_360;
  undefined8 *local_358;
  long *local_350;
  int local_344;
  undefined8 *local_340;
  float local_334;
  float local_330;
  float local_32c;
  float local_328;
  float local_324;
  float local_320;
  float local_31c;
  float local_318;
  float local_314;
  long *local_310;
  float local_304 [3];
  long *local_2f8;
  undefined8 local_2f0;
  long *local_2e8;
  undefined8 local_2e0;
  long *local_2d8;
  undefined8 local_2d0;
  long *local_2c8;
  undefined8 local_2c0;
  long *local_2b8;
  undefined1 local_2ad;
  int local_2ac;
  undefined8 *local_2a0;
  undefined1 local_27d;
  int local_27c;
  undefined8 *local_270;
  undefined8 *local_208;
  undefined1 (*local_200) [16];
  ulong local_1f8;
  undefined8 uStack_1f0;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  undefined8 local_198;
  undefined8 uStack_190;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [16];
  ulong local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined1 local_138 [16];
  undefined8 local_128;
  undefined8 uStack_120;
  undefined1 local_118 [16];
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  long local_d8;
  undefined4 local_cc;
  long local_c8;
  undefined8 *local_c0;
  undefined4 local_b4;
  int local_b0;
  int local_ac;
  undefined8 *local_a8;
  long local_a0;
  undefined4 local_94;
  long local_90;
  long local_88;
  undefined4 local_7c;
  int local_78;
  int local_74;
  undefined8 *local_70;
  long local_68;
  undefined4 local_5c;
  long local_58;
  long local_50;
  undefined4 local_44;
  int local_40;
  int local_3c;
  undefined8 *local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_44c = *(int *)((long)in_RDI + 0x2c);
  local_450 = (int)in_RDI[7];
  local_454 = *(int *)((long)in_RSI + 0x2c);
  local_458 = (int)in_RSI[6];
  local_45c = (int)in_RSI[7];
  local_460 = in_R8D * in_R9D;
  local_448 = in_R9D;
  local_444 = in_R8D;
  local_440 = in_RCX;
  local_438 = in_RDX;
  local_430 = in_RSI;
  local_428 = in_RDI;
  std::allocator<int>::allocator((allocator<int> *)0x869a51);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
             CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),in_stack_fffffffffffff950
            );
  std::allocator<int>::~allocator((allocator<int> *)0x869a7d);
  local_498 = std::vector<int,_std::allocator<int>_>::operator[](&local_478,0);
  local_49c = 0;
  local_4a0 = 0;
  local_4a4 = local_44c * in_stack_00000010 - local_444 * in_stack_00000008;
  for (local_4a8 = 0; local_4a8 < local_448; local_4a8 = local_4a8 + 1) {
    for (local_4ac = 0; local_4ac < local_444; local_4ac = local_4ac + 1) {
      local_498[local_49c] = local_4a0;
      local_49c = local_49c + 1;
      local_4a0 = in_stack_00000008 + local_4a0;
    }
    local_4a0 = local_4a4 + local_4a0;
  }
  local_350 = local_440;
  local_4b8 = *local_440;
  for (local_4bc = 0; local_4bc < local_45c; local_4bc = local_4bc + 1) {
    local_380 = &local_510;
    local_3c = *(int *)((long)local_430 + 0x2c);
    local_40 = (int)local_430[6];
    local_44 = *(undefined4 *)((long)local_430 + 0x34);
    local_4c8 = *local_430 + local_430[8] * (long)local_4bc * local_430[2];
    local_58 = local_430[2];
    local_5c = (undefined4)local_430[3];
    local_68 = local_430[4];
    local_38 = &local_510;
    local_28 = (long)local_3c * (long)local_40 * local_58;
    local_360 = &local_510;
    local_420 = &local_510;
    local_2c = 0x10;
    local_38c = local_4bc;
    local_38d = 1;
    local_510 = 0;
    local_500 = 0;
    local_4f8 = 0;
    local_4e8 = 0;
    local_4e4 = 0;
    local_4e0 = 0;
    local_4dc = 0;
    local_4d8 = 0;
    local_4d0 = 0;
    local_508 = 0;
    local_398 = local_420;
    local_50 = local_4c8;
    local_4f0 = local_68;
    for (local_514 = 0; local_514 < local_458; local_514 = local_514 + 1) {
      for (local_518 = 0; local_518 < local_454; local_518 = local_518 + 1) {
        local_51c = 0.0;
        if (local_4b8 != 0) {
          local_51c = *(float *)(local_4b8 + (long)local_4bc * 4);
        }
        local_270 = &local_588;
        local_ac = *(int *)((long)local_438 + 0x2c);
        local_b0 = (int)local_438[6];
        local_b4 = *(undefined4 *)((long)local_438 + 0x34);
        local_c0 = (undefined8 *)(*local_438 + local_438[8] * (long)local_4bc * local_438[2]);
        local_c8 = local_438[2];
        local_cc = (undefined4)local_438[3];
        local_d8 = local_438[4];
        local_a8 = &local_588;
        local_8 = (long)local_ac * (long)local_b0 * local_c8;
        local_358 = &local_588;
        local_410 = &local_588;
        local_c = 0x10;
        uStack_e0 = 0;
        local_e8 = 0;
        local_27c = local_4bc;
        local_27d = 1;
        uStack_530 = 0;
        local_538 = 0;
        local_588 = 0;
        local_578 = 0;
        local_570 = 0;
        local_560 = 0;
        local_55c = 0;
        local_558 = 0;
        local_554 = 0;
        local_550 = 0;
        local_548 = 0;
        local_580 = 0;
        local_540 = local_c0;
        for (local_58c = 0; local_58c < local_450; local_58c = local_58c + 1) {
          local_2a0 = &local_5d8;
          local_74 = *(int *)((long)local_428 + 0x2c);
          local_78 = (int)local_428[6];
          local_7c = *(undefined4 *)((long)local_428 + 0x34);
          local_88 = *local_428 + local_428[8] * (long)local_58c * local_428[2];
          local_90 = local_428[2];
          local_94 = (undefined4)local_428[3];
          local_a0 = local_428[4];
          local_70 = &local_5d8;
          local_18 = (long)local_74 * (long)local_78 * local_90;
          local_344 = local_514 * in_stack_00000020;
          local_340 = &local_5d8;
          for (local_5e4 = 0; local_5e4 < local_460; local_5e4 = local_5e4 + 1) {
            local_200 = (undefined1 (*) [16])
                        (local_88 + (long)local_74 * (long)local_344 * local_90 +
                         (long)(local_518 * in_stack_00000018 * 4) * 4 +
                        (long)(local_498[local_5e4] << 2) * 4);
            uVar1 = *(undefined8 *)*local_200;
            uVar2 = *(undefined8 *)(*local_200 + 8);
            local_138 = *local_200;
            local_208 = local_540;
            local_148 = *local_540;
            uStack_140 = local_540[1];
            local_158 = local_538;
            uStack_150 = uStack_530;
            local_f8._0_4_ = (float)uVar1;
            local_f8._4_4_ = (float)((ulong)uVar1 >> 0x20);
            uStack_f0._0_4_ = (float)uVar2;
            uStack_f0._4_4_ = (float)((ulong)uVar2 >> 0x20);
            local_108._0_4_ = (float)local_148;
            local_108._4_4_ = (float)((ulong)local_148 >> 0x20);
            uStack_100._0_4_ = (float)uStack_140;
            uStack_100._4_4_ = (float)((ulong)uStack_140 >> 0x20);
            local_118._0_4_ = (float)local_f8 * (float)local_108;
            local_118._4_4_ = local_f8._4_4_ * local_108._4_4_;
            local_118._8_4_ = (float)uStack_f0 * (float)uStack_100;
            local_118._12_4_ = uStack_f0._4_4_ * uStack_100._4_4_;
            uVar3 = local_538;
            uVar4 = uStack_530;
            local_128._0_4_ = (float)local_538;
            local_128._4_4_ = (float)((ulong)local_538 >> 0x20);
            uStack_120._0_4_ = (float)uStack_530;
            uStack_120._4_4_ = (float)((ulong)uStack_530 >> 0x20);
            local_538 = CONCAT44(local_118._4_4_ + local_128._4_4_,
                                 local_118._0_4_ + (float)local_128);
            uStack_530 = CONCAT44(local_118._12_4_ + uStack_120._4_4_,
                                  local_118._8_4_ + (float)uStack_120);
            local_540 = local_540 + 2;
            local_128 = uVar3;
            uStack_120 = uVar4;
            local_108 = local_148;
            uStack_100 = uStack_140;
            local_f8 = uVar1;
            uStack_f0 = uVar2;
          }
          in_stack_fffffffffffff950 = (allocator_type *)&local_5d8;
          local_1c = 0x10;
          local_2ac = local_58c;
          local_2ad = 1;
          local_5d8 = 0;
          local_5c8 = 0;
          local_5c0 = 0;
          local_5b0 = 0;
          local_5ac = 0;
          local_5a8 = 0;
          local_5a4 = 0;
          local_5a0 = 0;
          local_598 = 0;
          local_5d0 = 0;
          local_400 = in_stack_fffffffffffff950;
          local_3d8 = in_stack_fffffffffffff950;
          local_5b8 = local_a0;
        }
        local_1d8 = local_538;
        uStack_1d0 = uStack_530;
        local_1b8 = local_538;
        uStack_1b0 = uStack_530;
        local_1c8 = local_538;
        uStack_1c0 = uStack_530;
        auVar5._8_8_ = uStack_530;
        auVar5._0_8_ = local_538;
        auVar8._8_8_ = uStack_530;
        auVar8._0_8_ = local_538;
        _local_1a8 = vunpckhpd_avx(auVar8,auVar5);
        local_198 = local_538;
        uVar1 = local_198;
        uStack_190 = uStack_530;
        uVar2 = uStack_190;
        local_198._0_4_ = (float)local_538;
        local_198._4_4_ = (float)((ulong)local_538 >> 0x20);
        uStack_190._0_4_ = (float)uStack_530;
        uStack_190._4_4_ = (float)((ulong)uStack_530 >> 0x20);
        local_1e8 = (float)local_198 + (float)local_1a8._0_4_;
        fStack_1e4 = local_198._4_4_ + (float)local_1a8._4_4_;
        fStack_1e0 = (float)uStack_190 + fStack_1a0;
        fStack_1dc = uStack_190._4_4_ + fStack_19c;
        local_178._0_4_ = local_1e8 + fStack_1e4;
        auVar8 = ZEXT416((uint)local_178._0_4_);
        local_178._4_4_ = 0;
        local_1f8 = local_178._0_8_;
        uStack_1f0 = 0;
        local_168 = local_178._0_8_;
        uStack_160 = 0;
        local_6bc = local_51c + (float)local_178._0_4_;
        local_310 = in_stack_00000030;
        local_3b8 = local_410;
        local_304[0] = local_6bc;
        local_198 = uVar1;
        uStack_190 = uVar2;
        local_188 = fStack_1e4;
        fStack_184 = fStack_1e4;
        fStack_180 = fStack_1e4;
        fStack_17c = fStack_1e4;
        local_178 = auVar8;
        local_568 = local_d8;
        local_51c = local_6bc;
        switch(in_stack_00000028) {
        case 1:
          dVar7 = std::fmax((double)(ulong)(uint)local_6bc,0.0);
          local_304[0] = SUB84(dVar7,0);
          break;
        case 2:
          local_2b8 = in_stack_00000030;
          local_2c0 = 0;
          local_314 = *(float *)*in_stack_00000030;
          if (local_6bc <= 0.0) {
            local_6bc = local_6bc * local_314;
          }
          local_304[0] = local_6bc;
          break;
        case 3:
          local_2c8 = in_stack_00000030;
          local_2d0 = 0;
          local_318 = *(float *)*in_stack_00000030;
          local_2d8 = in_stack_00000030;
          local_2e0 = 1;
          local_31c = *(float *)(*in_stack_00000030 + 4);
          if (local_6bc < local_318) {
            local_304[0] = local_318;
          }
          if (local_31c < local_304[0]) {
            local_304[0] = local_31c;
          }
          break;
        case 4:
          local_320 = 88.37626;
          pfVar6 = std::min<float>(local_304,&local_320);
          local_304[0] = *pfVar6;
          local_324 = -88.37626;
          pfVar6 = std::max<float>(local_304,&local_324);
          local_304[0] = *pfVar6;
          dVar7 = std::exp((double)(ulong)(uint)-local_304[0]);
          local_304[0] = 1.0 / (SUB84(dVar7,0) + 1.0);
          break;
        case 5:
          dVar7 = std::exp((double)(ulong)(uint)local_6bc);
          dVar7 = std::log((double)(ulong)(uint)(SUB84(dVar7,0) + 1.0));
          dVar7 = std::tanh(dVar7);
          local_304[0] = local_6bc * SUB84(dVar7,0);
          break;
        case 6:
          local_2e8 = in_stack_00000030;
          local_2f0 = 0;
          local_328 = *(float *)*in_stack_00000030;
          local_2f8 = in_stack_00000030;
          local_304[1] = 1.4013e-45;
          local_304[2] = 0.0;
          local_32c = *(float *)(*in_stack_00000030 + 4);
          local_330 = -local_32c / local_328;
          local_334 = 1.0 / local_328 + local_330;
          if (local_330 <= local_6bc) {
            if (local_6bc <= local_334) {
              local_304[0] = local_6bc * (local_6bc * local_328 + local_32c);
            }
          }
          else {
            local_304[0] = 0.0;
          }
        }
        local_51c = local_304[0];
        *(float *)(local_4c8 + (long)local_518 * 4) = local_304[0];
      }
      local_4c8 = local_4c8 + (long)local_454 * 4;
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff950);
  return;
}

Assistant:

static void convolution_pack4to1_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_packed, const Mat& bias_data, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    int w = bottom_blob.w;
    int channels = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    const float* bias_data_ptr = bias_data;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_data_ptr)
                {
                    sum = bias_data_ptr[p];
                }

                __m128 _sum = _mm_setzero_ps();

                const float* kptr = weight_data_packed.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                    for (int k = 0; k < maxk; k++)
                    {
                        __m128 _val = _mm_load_ps(sptr + space_ofs[k] * 4);
                        __m128 _w = _mm_load_ps(kptr);
                        _sum = _mm_comp_fmadd_ps(_val, _w, _sum);

                        kptr += 4;
                    }
                }

                sum += _mm_reduce_add_ps(_sum);

                sum = activation_ss(sum, activation_type, activation_params);

                outptr[j] = sum;
            }

            outptr += outw;
        }
    }
}